

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  bool resolveRelative_local;
  PreprocessContext context_local;
  string *input_local;
  
  if (context == StripAllGeneratorExpressions) {
    stripAllGeneratorExpressions(__return_storage_ptr__,input);
  }
  else {
    if ((context != BuildInterface) && (context != InstallInterface)) {
      __assert_fail("false && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpression.cxx"
                    ,0x15a,
                    "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                   );
    }
    stripExportInterface(__return_storage_ptr__,input,context,resolveRelative);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string& input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions) {
    return stripAllGeneratorExpressions(input);
  }
  if (context == BuildInterface || context == InstallInterface) {
    return stripExportInterface(input, context, resolveRelative);
  }

  assert(false &&
         "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}